

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorExpression.cxx
# Opt level: O2

string * cmGeneratorExpression::StripEmptyListElements(string *__return_storage_ptr__,string *input)

{
  char *pcVar1;
  bool bVar2;
  bool bVar3;
  long lVar4;
  char *pcVar5;
  char *pcVar6;
  bool bVar7;
  
  lVar4 = std::__cxx11::string::find((char)input,0x3b);
  if (lVar4 == -1) {
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)input);
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    std::__cxx11::string::reserve((ulong)__return_storage_ptr__);
    pcVar5 = (input->_M_dataplus)._M_p;
    pcVar1 = pcVar5;
    bVar2 = true;
    while( true ) {
      pcVar6 = pcVar1 + 1;
      if (*pcVar1 == '\0') break;
      bVar7 = *pcVar1 == ';';
      bVar3 = (bool)(bVar2 & bVar7);
      pcVar1 = pcVar6;
      bVar2 = bVar7;
      if (bVar3) {
        std::__cxx11::string::append((char *)__return_storage_ptr__,(ulong)pcVar5);
        pcVar5 = pcVar6;
      }
    }
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    if ((__return_storage_ptr__->_M_string_length != 0) &&
       ((__return_storage_ptr__->_M_dataplus)._M_p[__return_storage_ptr__->_M_string_length - 1] ==
        ';')) {
      std::__cxx11::string::resize((ulong)__return_storage_ptr__);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmGeneratorExpression::StripEmptyListElements(
                                                    const std::string &input)
{
  if (input.find(';') == input.npos)
    {
    return input;
    }
  std::string result;
  result.reserve(input.size());

  const char *c = input.c_str();
  const char *last = c;
  bool skipSemiColons = true;
  for ( ; *c; ++c)
    {
    if(*c == ';')
      {
      if(skipSemiColons)
        {
        result.append(last, c - last);
        last = c + 1;
        }
      skipSemiColons = true;
      }
    else
      {
      skipSemiColons = false;
      }
    }
  result.append(last);

  if (!result.empty() && *(result.end() - 1) == ';')
    {
    result.resize(result.size() - 1);
    }

  return result;
}